

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

VarValue *
deqp::gles2::Functional::generateRandomVarValue
          (VarValue *__return_storage_ptr__,DataType type,Random *rnd,int samplerUnit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  int local_30;
  int local_2c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int numElems;
  int samplerUnit_local;
  Random *rnd_local;
  DataType type_local;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  bVar1 = glu::isDataTypeFloatOrVec(type);
  if ((bVar1) || (bVar1 = glu::isDataTypeMatrix(type), bVar1)) {
    for (i_2 = 0; i_2 < iVar2; i_2 = i_2 + 1) {
      fVar4 = de::Random::getFloat(rnd,-10.0,10.0);
      *(float *)((long)&__return_storage_ptr__->val + (long)i_2 * 4) = fVar4;
    }
  }
  else {
    bVar1 = glu::isDataTypeIntOrIVec(type);
    if (bVar1) {
      for (i_3 = 0; i_3 < iVar2; i_3 = i_3 + 1) {
        iVar3 = de::Random::getInt(rnd,-10,10);
        *(int *)((long)&__return_storage_ptr__->val + (long)i_3 * 4) = iVar3;
      }
    }
    else {
      bVar1 = glu::isDataTypeBoolOrBVec(type);
      if (bVar1) {
        for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
          bVar1 = de::Random::getBool(rnd);
          (__return_storage_ptr__->val).boolV[local_2c] = bVar1;
        }
      }
      else {
        bVar1 = glu::isDataTypeSampler(type);
        if (bVar1) {
          (__return_storage_ptr__->val).samplerV.unit = samplerUnit;
          for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
            fVar4 = de::Random::getFloat(rnd,0.0,1.0);
            *(float *)((long)&__return_storage_ptr__->val + (long)local_30 * 4 + 4) = fVar4;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateRandomVarValue (const glu::DataType type, Random& rnd, int samplerUnit = -1 /* Used if type is a sampler type. \note Samplers' unit numbers are not randomized. */)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	DE_ASSERT((samplerUnit >= 0) == (glu::isDataTypeSampler(type)));

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = rnd.getFloat(-10.0f, 10.0f);
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = rnd.getInt(-10, 10);
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = rnd.getBool();
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = samplerUnit;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = rnd.getFloat(0.0f, 1.0f);
	}
	else
		DE_ASSERT(false);

	return result;
}